

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureException::GoogleTestFailureException
          (GoogleTestFailureException *this,TestPartResult *failure)

{
  char *pcVar1;
  runtime_error *in_RDI;
  string local_30 [48];
  
  PrintTestPartResultToString_abi_cxx11_(failure);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(in_RDI,pcVar1);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)in_RDI = &PTR__GoogleTestFailureException_001db468;
  return;
}

Assistant:

GoogleTestFailureException::GoogleTestFailureException(
    const TestPartResult& failure)
    : ::std::runtime_error(PrintTestPartResultToString(failure).c_str()) {}